

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5SentenceFinderAdd(Fts5SFinder *p,int iAdd)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  
  iVar1 = p->nFirstAlloc;
  iVar3 = p->nFirst;
  if (iVar1 == iVar3) {
    iVar3 = 0x40;
    if (iVar1 != 0) {
      iVar3 = iVar1 * 2;
    }
    piVar2 = (int *)sqlite3_realloc64(p->aFirst,(long)iVar3 << 2);
    if (piVar2 == (int *)0x0) {
      return 7;
    }
    p->aFirst = piVar2;
    p->nFirstAlloc = iVar3;
    iVar3 = p->nFirst;
  }
  else {
    piVar2 = p->aFirst;
  }
  p->nFirst = iVar3 + 1;
  piVar2[iVar3] = iAdd;
  return 0;
}

Assistant:

static int fts5SentenceFinderAdd(Fts5SFinder *p, int iAdd){
  if( p->nFirstAlloc==p->nFirst ){
    int nNew = p->nFirstAlloc ? p->nFirstAlloc*2 : 64;
    int *aNew;

    aNew = (int*)sqlite3_realloc64(p->aFirst, nNew*sizeof(int));
    if( aNew==0 ) return SQLITE_NOMEM;
    p->aFirst = aNew;
    p->nFirstAlloc = nNew;
  }
  p->aFirst[p->nFirst++] = iAdd;
  return SQLITE_OK;
}